

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_meta_dep(CVmImageLoader *this,ulong siz)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  vm_meta_entry_t *pvVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  ushort *puVar12;
  ulong uVar13;
  ushort uVar14;
  ulong func_cnt;
  ulong uVar15;
  ushort uVar16;
  bool bVar17;
  char buf [266];
  ulong local_190;
  undefined1 local_148 [3];
  ushort auStack_145 [138];
  
  if ((this->field_0x90 & 1) != 0) {
    err_throw(0x139);
  }
  this->field_0x90 = this->field_0x90 | 1;
  CVmMetaTable::clear(G_meta_table_X);
  if (siz < 2) {
LAB_002965e4:
    err_throw(0x132);
  }
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_148,2);
  uVar7 = (ulong)(ushort)local_148._0_2_;
  if (uVar7 != 0) {
    uVar9 = siz - 2;
    local_190 = 0;
    do {
      if ((uVar9 < 2) || ((*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_148,2), uVar9 == 2))
      goto LAB_002965e4;
      uVar10 = (ulong)(ushort)local_148._0_2_;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_148,1);
      uVar15 = (ulong)local_148[0];
      uVar13 = (uVar9 - 3) - uVar15;
      if (uVar9 - 3 < uVar15) goto LAB_002965e4;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_148,uVar15);
      local_148[uVar15] = 0;
      if (uVar13 < 4) goto LAB_002965e4;
      puVar12 = (ushort *)(local_148 + uVar15 + 1);
      uVar13 = uVar13 - 4;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,puVar12,4);
      uVar1 = *(ushort *)(local_148 + uVar15 + 1);
      func_cnt = (ulong)uVar1;
      uVar2 = *(ushort *)((long)auStack_145 + uVar15);
      iVar6 = (*this->fp_->_vptr_CVmImageFile[8])();
      if (func_cnt == 0) {
        uVar5 = 0;
        uVar14 = 0;
      }
      else {
        uVar11 = 0;
        uVar15 = uVar13;
        uVar8 = 0;
        uVar16 = 0;
        do {
          if (uVar15 < 2) goto LAB_002965e4;
          uVar15 = uVar15 - 2;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,puVar12,2);
          if (2 < uVar2) {
            bVar17 = uVar15 < uVar2 - 2;
            uVar15 = uVar15 - (uVar2 - 2);
            if (bVar17) goto LAB_002965e4;
            (*this->fp_->_vptr_CVmImageFile[9])();
          }
          uVar3 = *puVar12;
          uVar5 = uVar3;
          uVar14 = uVar3;
          if (uVar11 != 0) {
            uVar14 = uVar8;
            if (uVar3 < uVar8) {
              uVar14 = uVar3;
            }
            uVar5 = uVar16;
            if (uVar16 < uVar3) {
              uVar5 = uVar3;
            }
          }
          uVar11 = uVar11 + 1;
          uVar8 = uVar14;
          uVar16 = uVar5;
        } while (uVar1 != uVar11);
      }
      CVmMetaTable::add_entry(G_meta_table_X,local_148,func_cnt,uVar14,uVar5);
      pvVar4 = G_meta_table_X->table_;
      (*this->fp_->_vptr_CVmImageFile[7])(this->fp_,CONCAT44(extraout_var,iVar6));
      if (func_cnt != 0) {
        uVar15 = (ulong)(uVar2 - 2);
        uVar14 = 1;
        do {
          if (uVar13 < 2) goto LAB_002965e4;
          uVar13 = uVar13 - 2;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,puVar12,2);
          if (2 < uVar2) {
            bVar17 = uVar13 < uVar15;
            uVar13 = uVar13 - uVar15;
            if (bVar17) goto LAB_002965e4;
            (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar15);
          }
          uVar5 = *puVar12;
          pvVar4[local_190].prop_xlat_[(ulong)uVar5 - (ulong)pvVar4[local_190].min_prop_] = uVar14;
          pvVar4[local_190].func_xlat_[(ulong)uVar14 - 1] = uVar5;
          uVar14 = uVar14 + 1;
        } while (uVar14 <= uVar1);
      }
      uVar10 = uVar9 - uVar10;
      uVar9 = uVar13;
      if (uVar10 < uVar13) {
        (*this->fp_->_vptr_CVmImageFile[9])();
        uVar9 = uVar10;
      }
      local_190 = local_190 + 1;
    } while (local_190 != uVar7);
  }
  CVmMetaTable::add_entry_if_new(G_meta_table_X,CVmObject::metaclass_reg_->meta_reg_idx_,0,0,0);
  return;
}

Assistant:

void CVmImageLoader::load_meta_dep(VMG_ ulong siz)
{
    char buf[256 + 10];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_meta_dep_)
        err_throw(VMERR_IMAGE_METADEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_meta_dep_ = TRUE;

    /* 
     *   reset the global metaclass table, in case there was anything
     *   defined by a previously-loaded image - since a metaclass's index
     *   in the table is implicit in the load order, we need to make sure
     *   we're starting with a completely clean configuration 
     */
    G_meta_table->clear();
    
    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        ushort j;
        uint len;
        uint prop_cnt;
        uint prop_len;
        vm_meta_entry_t *entry;
        char *p;
        ulong done_size;
        long prop_start_ofs;
        ulong prop_start_siz;
        vm_prop_id_t max_prop;
        vm_prop_id_t min_prop;

        /* 
         *   read the record size, and calculate the value of 'siz' that
         *   we expect when we've parsed this entire record - it's the
         *   current size minus the size of the record (note that we have
         *   to add back in the two bytes of the size record itself, since
         *   'siz' will have been moved past the size record once we've
         *   read it) 
         */
        read_data(buf, 2, &siz);
        done_size = (siz + 2) - osrp2(buf);
        
        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';
        p = buf + len + 1;

        /* read the property table information */
        read_data(p, 4, &siz);
        prop_cnt = osrp2(p);
        prop_len = osrp2(p + 2);

        /* 
         *   set min and max to 'invalid' to start with, in case there are
         *   no properties at all in the table
         */
        min_prop = max_prop = VM_INVALID_PROP;

        /* 
         *   Read the properties - pass one: find the minimum and maximum
         *   property ID in the table.  Before we begin, remember where
         *   the properties start in the file, so we can go back and read
         *   the table again on the second pass.  
         */
        prop_start_ofs = fp_->get_seek();
        prop_start_siz = siz;
        for (j = 0 ; j < prop_cnt ; ++j)
        {
            vm_prop_id_t cur;
            
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* get the property */
            cur = (vm_prop_id_t)osrp2(p);

            /* 
             *   if this is the first property, it's the max and min so
             *   far; otherwise, remember it if it's the highest or lowest
             *   so far 
             */
            if (j == 0)
            {
                /* this is the first one, so note it unconditionally */
                min_prop = max_prop = cur;
            }
            else
            {
                /* if it's below the current minimum, it's the new minimum */
                if (cur < min_prop)
                    min_prop = cur;

                /* if it's above the current maximum, it's the new maximum */
                if (cur > max_prop)
                    max_prop = cur;
            }
        }

        /* 
         *   Now that we know the minimum and maximum properties in the
         *   table, we can create the dependency record. 
         */
        G_meta_table->add_entry(buf, prop_cnt, min_prop, max_prop);

        /* get a pointer to my new entry */
        entry = G_meta_table->get_entry(i);

        /*
         *   Pass two: read the actual properties into the translation
         *   table.  Seek back to the start of the properties in the file,
         *   then read the ID's.
         *   
         *   Note that add_prop_xlat() expects a 1-based function table
         *   index.  We are in fact reading a function table, so run our
         *   function index counter from 1 to the entry count to yield the
         *   proper 1-based index values.  
         */
        fp_->seek(prop_start_ofs);
        siz = prop_start_siz;
        for (j = 1 ; j <= prop_cnt ; ++j)
        {
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* add this entry */
            entry->add_prop_xlat((vm_prop_id_t)osrp2(p), j);
        }

        /* skip any remaining data in the record */
        if (siz > done_size)
            skip_data(siz - done_size, &siz);
    }

    /* 
     *   always add the root object metaclass to the table, whether the
     *   image file defines it or not 
     */
    G_meta_table
        ->add_entry_if_new(CVmObject::metaclass_reg_->get_reg_idx(),
                           0, VM_INVALID_PROP, VM_INVALID_PROP);
}